

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

LinearSpace3fa * __thiscall
embree::avx512::LineSegmentsISA::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,LineSegmentsISA *this,size_t primID,
          BBox1f time_range)

{
  BBox1f BVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  float fVar12;
  float fVar15;
  float fVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 local_28 [16];
  
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = time_range;
  BVar1 = (this->super_LineSegments).super_Geometry.time_range;
  auVar13._8_8_ = 0;
  auVar13._0_4_ = BVar1.lower;
  auVar13._4_4_ = BVar1.upper;
  fVar17 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar15 = BVar1.lower;
  auVar13 = vmovshdup_avx(auVar13);
  fVar12 = auVar13._0_4_ - fVar15;
  auVar8 = vmovshdup_avx(auVar11._0_16_);
  auVar13 = ZEXT416((uint)(fVar17 * ((time_range.lower - fVar15) / fVar12) * 1.0000002));
  auVar13 = vroundss_avx(auVar13,auVar13,9);
  auVar13 = vmaxss_avx(ZEXT816(0),auVar13);
  auVar8 = ZEXT416((uint)(fVar17 * ((auVar8._0_4_ - fVar15) / fVar12) * 0.99999976));
  auVar8 = vroundss_avx(auVar8,auVar8,10);
  auVar8 = vminss_avx(auVar8,ZEXT416((uint)fVar17));
  if ((int)auVar8._0_4_ == (int)auVar13._0_4_) {
    auVar13 = vdpps_avx(_DAT_01f7b620,_DAT_01f7b620,0x7f);
    auVar7 = SUB6416(ZEXT464(0xbf800000),0);
    auVar8 = vdpps_avx(auVar7,auVar7,0x7f);
    uVar2 = vcmpps_avx512vl(auVar8,auVar13,1);
    auVar13 = vpmovm2d_avx512vl(uVar2);
    auVar14._0_4_ = auVar13._0_4_;
    auVar14._4_4_ = auVar14._0_4_;
    auVar14._8_4_ = auVar14._0_4_;
    auVar14._12_4_ = auVar14._0_4_;
    uVar5 = vpmovd2m_avx512vl(auVar14);
    auVar13 = vpcmpeqd_avx(auVar14,auVar14);
    auVar6._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar13._4_4_;
    auVar6._0_4_ = (uint)((byte)uVar5 & 1) * auVar13._0_4_;
    auVar6._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar13._8_4_;
    auVar6._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar13._12_4_;
    auVar13 = vblendvps_avx(auVar7,_DAT_01f7b620,auVar6);
    auVar8 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar7 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)auVar8._0_4_));
    fVar17 = auVar7._0_4_;
    fVar17 = fVar17 * 1.5 - auVar8._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar18._0_4_ = auVar13._0_4_ * fVar17;
    aVar18._4_4_ = auVar13._4_4_ * fVar17;
    aVar18._8_4_ = auVar13._8_4_ * fVar17;
    aVar18._12_4_ = auVar13._12_4_ * fVar17;
    auVar13 = vshufps_avx((undefined1  [16])aVar18,(undefined1  [16])aVar18,0xc9);
    auVar26._0_4_ = aVar18._0_4_ * -0.0;
    auVar26._4_4_ = aVar18._4_4_ * -1.0;
    auVar26._8_4_ = aVar18._8_4_ * -0.0;
    auVar26._12_4_ = aVar18._12_4_ * -0.0;
    auVar13 = vfmadd231ps_fma(auVar26,(undefined1  [16])_DAT_01f46750,auVar13);
    auVar8 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar13 = vdpps_avx(auVar8,auVar8,0x7f);
    auVar7 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)auVar13._0_4_));
    fVar17 = auVar7._0_4_;
    fVar17 = fVar17 * 1.5 - auVar13._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar10 = _DAT_01f46750;
  }
  else {
    (*(this->super_LineSegments).super_Geometry.super_RefCount._vptr_RefCount[0x38])
              (local_28,this,primID & 0xffffffff,
               (long)(((int)auVar13._0_4_ + (int)auVar8._0_4_) / 2));
    auVar13 = vdpps_avx(local_28,local_28,0x7f);
    auVar4 = ZEXT812(0) << 0x20;
    auVar6 = ZEXT816(0) << 0x40;
    auVar20._4_12_ = auVar4;
    auVar20._0_4_ = auVar13._0_4_;
    auVar8 = vrsqrt14ss_avx512f(auVar6,auVar20);
    fVar17 = auVar8._0_4_;
    fVar17 = fVar17 * 1.5 + auVar13._0_4_ * -0.5 * fVar17 * fVar17 * fVar17;
    aVar10._0_4_ = local_28._0_4_ * fVar17;
    aVar10._4_4_ = local_28._4_4_ * fVar17;
    aVar10._8_4_ = local_28._8_4_ * fVar17;
    aVar10._12_4_ = local_28._12_4_ * fVar17;
    auVar8._8_4_ = 0xff7fffff;
    auVar8._0_8_ = 0xff7fffffff7fffff;
    auVar8._12_4_ = 0xff7fffff;
    uVar2 = vcmpps_avx512vl((undefined1  [16])aVar10,auVar8,5);
    auVar7._8_4_ = 0x7f7fffff;
    auVar7._0_8_ = 0x7f7fffff7f7fffff;
    auVar7._12_4_ = 0x7f7fffff;
    uVar3 = vcmpps_avx512vl((undefined1  [16])aVar10,auVar7,2);
    if ((~((ushort)uVar2 & (ushort)uVar3) & 7) != 0) {
      fVar12 = 0.0;
      fVar15 = 1.0;
      fVar16 = 0.0;
      fVar17 = 0.0;
      aVar18 = SUB6416(ZEXT464(0x3f800000),0);
      aVar10 = _DAT_01f46750;
      goto LAB_01c4e512;
    }
    auVar8 = vshufpd_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,1);
    auVar13 = vmovshdup_avx((undefined1  [16])aVar10);
    auVar22._8_4_ = 0x80000000;
    auVar22._0_8_ = 0x8000000080000000;
    auVar22._12_4_ = 0x80000000;
    auVar21._0_4_ = auVar13._0_4_ ^ 0x80000000;
    auVar13 = vunpckhps_avx((undefined1  [16])aVar10,auVar6);
    auVar21._4_12_ = auVar4;
    auVar20 = vshufps_avx(auVar13,auVar21,0x41);
    auVar13 = vdpps_avx(auVar20,auVar20,0x7f);
    auVar19._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
    auVar19._8_8_ = auVar8._8_8_ ^ auVar22._8_8_;
    auVar7 = vinsertps_avx(auVar19,(undefined1  [16])aVar10,0x2a);
    auVar8 = vdpps_avx(auVar7,auVar7,0x7f);
    uVar2 = vcmpps_avx512vl(auVar8,auVar13,1);
    auVar13 = vpmovm2d_avx512vl(uVar2);
    auVar23._0_4_ = auVar13._0_4_;
    auVar23._4_4_ = auVar23._0_4_;
    auVar23._8_4_ = auVar23._0_4_;
    auVar23._12_4_ = auVar23._0_4_;
    uVar5 = vpmovd2m_avx512vl(auVar23);
    auVar13 = vpcmpeqd_avx(auVar23,auVar23);
    auVar9._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar13._4_4_;
    auVar9._0_4_ = (uint)((byte)uVar5 & 1) * auVar13._0_4_;
    auVar9._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar13._8_4_;
    auVar9._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar13._12_4_;
    auVar13 = vblendvps_avx(auVar7,auVar20,auVar9);
    auVar8 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar24._4_12_ = auVar4;
    auVar24._0_4_ = auVar8._0_4_;
    auVar7 = vrsqrt14ss_avx512f(auVar6,auVar24);
    fVar17 = auVar7._0_4_;
    fVar17 = fVar17 * 1.5 - auVar8._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar18._0_4_ = auVar13._0_4_ * fVar17;
    aVar18._4_4_ = auVar13._4_4_ * fVar17;
    aVar18._8_4_ = auVar13._8_4_ * fVar17;
    aVar18._12_4_ = auVar13._12_4_ * fVar17;
    auVar13 = vshufps_avx((undefined1  [16])aVar18,(undefined1  [16])aVar18,0xc9);
    auVar8 = vshufps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0xc9);
    auVar25._0_4_ = aVar18._0_4_ * auVar8._0_4_;
    auVar25._4_4_ = aVar18._4_4_ * auVar8._4_4_;
    auVar25._8_4_ = aVar18._8_4_ * auVar8._8_4_;
    auVar25._12_4_ = aVar18._12_4_ * auVar8._12_4_;
    auVar13 = vfmsub231ps_fma(auVar25,(undefined1  [16])aVar10,auVar13);
    auVar8 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar13 = vdpps_avx(auVar8,auVar8,0x7f);
    auVar27._4_12_ = auVar4;
    auVar27._0_4_ = auVar13._0_4_;
    auVar7 = vrsqrt14ss_avx512f(auVar6,auVar27);
    fVar17 = auVar7._0_4_;
    fVar17 = fVar17 * 1.5 - auVar13._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
  }
  fVar12 = fVar17 * auVar8._0_4_;
  fVar15 = fVar17 * auVar8._4_4_;
  fVar16 = fVar17 * auVar8._8_4_;
  fVar17 = fVar17 * auVar8._12_4_;
LAB_01c4e512:
  (__return_storage_ptr__->vx).field_0 = aVar18;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar12;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar15;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar16;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar17;
  (__return_storage_ptr__->vz).field_0 = aVar10;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t itime = (tbounds.begin()+tbounds.end())/2;

        const Vec3fa dir = normalize(computeDirection(primID,itime));
        if (is_finite(dir)) return frame(dir);
        else return LinearSpace3fa(one);
      }